

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::TargetAmountMapData,_cfd::js::api::TargetAmountMapDataStruct>::
ConvertToStruct(vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::TargetAmountMapData,_cfd::js::api::TargetAmountMapDataStruct>
               *this)

{
  bool bVar1;
  undefined1 local_98 [8];
  TargetAmountMapDataStruct data;
  TargetAmountMapData *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::js::api::json::TargetAmountMapData,_cfd::js::api::TargetAmountMapDataStruct>
  *__range3;
  JsonObjectVector<cfd::js::api::json::TargetAmountMapData,_cfd::js::api::TargetAmountMapDataStruct>
  *this_local;
  vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  *result;
  
  std::
  vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ::vector(__return_storage_ptr__);
  __end0 = std::
           vector<cfd::js::api::json::TargetAmountMapData,_std::allocator<cfd::js::api::json::TargetAmountMapData>_>
           ::begin(&(this->super_JsonVector<cfd::js::api::json::TargetAmountMapData>).
                    super_vector<cfd::js::api::json::TargetAmountMapData,_std::allocator<cfd::js::api::json::TargetAmountMapData>_>
                  );
  element = (TargetAmountMapData *)
            std::
            vector<cfd::js::api::json::TargetAmountMapData,_std::allocator<cfd::js::api::json::TargetAmountMapData>_>
            ::end(&(this->super_JsonVector<cfd::js::api::json::TargetAmountMapData>).
                   super_vector<cfd::js::api::json::TargetAmountMapData,_std::allocator<cfd::js::api::json::TargetAmountMapData>_>
                 );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_cfd::js::api::json::TargetAmountMapData_*,_std::vector<cfd::js::api::json::TargetAmountMapData,_std::allocator<cfd::js::api::json::TargetAmountMapData>_>_>
                                     *)&element), bVar1) {
    data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_cfd::js::api::json::TargetAmountMapData_*,_std::vector<cfd::js::api::json::TargetAmountMapData,_std::allocator<cfd::js::api::json::TargetAmountMapData>_>_>
                 ::operator*(&__end0);
    js::api::json::TargetAmountMapData::ConvertToStruct
              ((TargetAmountMapDataStruct *)local_98,
               (TargetAmountMapData *)
               data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_98);
    js::api::TargetAmountMapDataStruct::~TargetAmountMapDataStruct
              ((TargetAmountMapDataStruct *)local_98);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::json::TargetAmountMapData_*,_std::vector<cfd::js::api::json::TargetAmountMapData,_std::allocator<cfd::js::api::json::TargetAmountMapData>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }